

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O3

Real __thiscall amrex::MultiFab::max(MultiFab *this,Box *region,int comp,int nghost,bool local)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int j;
  long lVar19;
  long lVar20;
  double dVar21;
  MFIter mfi;
  double local_108;
  undefined1 local_d0 [28];
  undefined4 uStack_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)this,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_108 = -1.79769313486232e+308;
    do {
      MFIter::growntilebox((Box *)local_d0,&local_90,nghost);
      iVar13 = local_d0._8_4_;
      iVar10 = local_d0._4_4_;
      uVar11 = local_d0._0_4_;
      iVar1 = (region->smallend).vect[0];
      iVar2 = (region->smallend).vect[1];
      iVar7 = iVar1;
      if (iVar1 < (int)local_d0._0_4_) {
        iVar7 = local_d0._0_4_;
      }
      iVar8 = iVar2;
      if (iVar2 < (int)local_d0._4_4_) {
        iVar8 = local_d0._4_4_;
      }
      iVar3 = (region->smallend).vect[2];
      iVar9 = iVar3;
      if (iVar3 < (int)local_d0._8_4_) {
        iVar9 = local_d0._8_4_;
      }
      iVar4 = (region->bigend).vect[0];
      if ((int)local_d0._12_4_ < iVar4) {
        iVar4 = local_d0._12_4_;
      }
      iVar5 = (region->bigend).vect[1];
      if ((int)local_d0._16_4_ < iVar5) {
        iVar5 = local_d0._16_4_;
      }
      iVar6 = (region->bigend).vect[2];
      if ((int)local_d0._20_4_ < iVar6) {
        iVar6 = local_d0._20_4_;
      }
      if ((((iVar7 <= iVar4) && (iVar8 <= iVar5)) && (iVar9 <= iVar6)) &&
         ((uint)local_d0._24_4_ < 8)) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_d0,&this->super_FabArray<amrex::FArrayBox>,
                   &local_90);
        if (iVar1 < (int)uVar11) {
          iVar1 = uVar11;
        }
        if (iVar10 < iVar2) {
          iVar10 = iVar2;
        }
        lVar12 = (long)iVar10;
        if (iVar13 < iVar3) {
          iVar13 = iVar3;
        }
        lVar15 = (long)iVar13;
        lVar16 = CONCAT44(local_d0._20_4_,local_d0._16_4_) * 8;
        lVar14 = CONCAT44(local_d0._12_4_,local_d0._8_4_) * 8;
        lVar17 = CONCAT44(uStack_b4,local_d0._24_4_) * (long)comp * 8 +
                 (lVar12 - local_ac) * lVar14 + (lVar15 - local_a8) * lVar16 + (long)iVar1 * 8 +
                 (long)local_b0 * -8 + CONCAT44(local_d0._4_4_,local_d0._0_4_);
        lVar19 = lVar12;
        lVar18 = lVar17;
        do {
          do {
            lVar20 = 0;
            dVar21 = local_108;
            do {
              local_108 = *(double *)(lVar17 + lVar20 * 8);
              if (local_108 <= dVar21) {
                local_108 = dVar21;
              }
              lVar20 = lVar20 + 1;
              dVar21 = local_108;
            } while ((iVar4 - iVar1) + 1 != (int)lVar20);
            lVar19 = lVar19 + 1;
            lVar17 = lVar17 + lVar14;
          } while (((iVar5 + iVar10) - iVar8) + 1 != (int)lVar19);
          lVar15 = lVar15 + 1;
          lVar17 = lVar18 + lVar16;
          lVar19 = lVar12;
          lVar18 = lVar17;
        } while (((iVar6 + iVar13) - iVar9) + 1 != (int)lVar15);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  else {
    local_108 = -1.79769313486232e+308;
  }
  MFIter::~MFIter(&local_90);
  return local_108;
}

Assistant:

Real
MultiFab::max (const Box& region, int comp, int nghost, bool local) const
{
    BL_PROFILE("MultiFab::max(region)");

    Real mx = std::numeric_limits<Real>::lowest();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        mx = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            if (region.contains(i,j,k)) {
                return ma[box_no](i,j,k,comp);
            } else {
                return AMREX_REAL_LOWEST;
            }
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mx)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
            Box const& bx = mfi.growntilebox(nghost) & region;
            if (bx.ok()) {
                auto const& a = this->const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    mx = std::max(mx, a(i,j,k,comp));
                });
            }
        }
    }

    if (!local) {
        ParallelAllReduce::Max(mx, ParallelContext::CommunicatorSub());
    }

    return mx;
}